

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O2

TemporalBinInfo * __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::RecalculatePrimRef<embree::Instance>,_2UL>
::TemporalBinInfo::operator=(TemporalBinInfo *this,TemporalBinInfo *param_1)

{
  size_t sVar1;
  undefined8 uVar2;
  
  sVar1 = param_1->count1[0];
  this->count0[0] = param_1->count0[0];
  this->count1[0] = sVar1;
  uVar2 = *(undefined8 *)((long)&param_1->bounds0[0].bounds0.lower.field_0 + 8);
  *(undefined8 *)&this->bounds0[0].bounds0.lower.field_0 =
       *(undefined8 *)&param_1->bounds0[0].bounds0.lower.field_0;
  *(undefined8 *)((long)&this->bounds0[0].bounds0.lower.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds0[0].bounds0.upper.field_0 + 8);
  *(undefined8 *)&this->bounds0[0].bounds0.upper.field_0 =
       *(undefined8 *)&param_1->bounds0[0].bounds0.upper.field_0;
  *(undefined8 *)((long)&this->bounds0[0].bounds0.upper.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds0[0].bounds1.lower.field_0 + 8);
  *(undefined8 *)&this->bounds0[0].bounds1.lower.field_0 =
       *(undefined8 *)&param_1->bounds0[0].bounds1.lower.field_0;
  *(undefined8 *)((long)&this->bounds0[0].bounds1.lower.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds0[0].bounds1.upper.field_0 + 8);
  *(undefined8 *)&this->bounds0[0].bounds1.upper.field_0 =
       *(undefined8 *)&param_1->bounds0[0].bounds1.upper.field_0;
  *(undefined8 *)((long)&this->bounds0[0].bounds1.upper.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds1[0].bounds0.lower.field_0 + 8);
  *(undefined8 *)&this->bounds1[0].bounds0.lower.field_0 =
       *(undefined8 *)&param_1->bounds1[0].bounds0.lower.field_0;
  *(undefined8 *)((long)&this->bounds1[0].bounds0.lower.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds1[0].bounds0.upper.field_0 + 8);
  *(undefined8 *)&this->bounds1[0].bounds0.upper.field_0 =
       *(undefined8 *)&param_1->bounds1[0].bounds0.upper.field_0;
  *(undefined8 *)((long)&this->bounds1[0].bounds0.upper.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds1[0].bounds1.lower.field_0 + 8);
  *(undefined8 *)&this->bounds1[0].bounds1.lower.field_0 =
       *(undefined8 *)&param_1->bounds1[0].bounds1.lower.field_0;
  *(undefined8 *)((long)&this->bounds1[0].bounds1.lower.field_0 + 8) = uVar2;
  uVar2 = *(undefined8 *)((long)&param_1->bounds1[0].bounds1.upper.field_0 + 8);
  *(undefined8 *)&this->bounds1[0].bounds1.upper.field_0 =
       *(undefined8 *)&param_1->bounds1[0].bounds1.upper.field_0;
  *(undefined8 *)((long)&this->bounds1[0].bounds1.upper.field_0 + 8) = uVar2;
  return this;
}

Assistant:

__forceinline TemporalBinInfo () {
          }